

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElementType::~IfcDistributionElementType
          (IfcDistributionElementType *this)

{
  ~IfcDistributionElementType(this);
  operator_delete(this);
  return;
}

Assistant:

IfcDistributionElementType() : Object("IfcDistributionElementType") {}